

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::io::CordInputStream::CordInputStream(CordInputStream *this,Cord *cord)

{
  size_t sVar1;
  
  (this->super_ZeroCopyInputStream)._vptr_ZeroCopyInputStream =
       (_func_int **)&PTR__ZeroCopyInputStream_00435d90;
  absl::lts_20250127::Cord::ChunkIterator::ChunkIterator(&(this->it_).chunk_iterator_,cord);
  sVar1 = absl::lts_20250127::Cord::InlineRep::size(&cord->contents_);
  this->length_ = sVar1;
  this->bytes_remaining_ = sVar1;
  LoadChunkData(this);
  return;
}

Assistant:

CordInputStream::CordInputStream(const absl::Cord* cord)
    : it_(cord->char_begin()),
      length_(cord->size()),
      bytes_remaining_(length_) {
  LoadChunkData();
}